

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

Field __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateField
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  bool bVar1;
  bool bVar2;
  Type type;
  PackedType packedType;
  Mutability mutability;
  Shareability share_local;
  HeapTypeGeneratorImpl *this_local;
  
  bVar1 = Random::oneIn(this->rand,2);
  bVar2 = Random::oneIn(this->rand,6);
  if (bVar2) {
    bVar2 = Random::oneIn(this->rand,2);
    packedType = i16;
    if (bVar2) {
      packedType = i8;
    }
    Field::Field((Field *)&this_local,packedType,(uint)bVar1);
  }
  else {
    type = generateSingleType(this,share);
    Field::Field((Field *)&this_local,type,(uint)bVar1);
  }
  return _this_local;
}

Assistant:

Field generateField(Shareability share) {
    auto mutability = rand.oneIn(2) ? Mutable : Immutable;
    if (rand.oneIn(6)) {
      return {rand.oneIn(2) ? Field::i8 : Field::i16, mutability};
    } else {
      return {generateSingleType(share), mutability};
    }
  }